

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O2

uint32_t __thiscall
icu_63::RuleBasedCollator::setVariableTop
          (RuleBasedCollator *this,UnicodeString *varTop,UErrorCode *errorCode)

{
  short sVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  uint32_t uVar2;
  char16_t *pcVar3;
  uint uVar4;
  
  pcVar3 = UnicodeString::getBuffer(varTop);
  sVar1 = (varTop->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar4 = (varTop->fUnion).fFields.fLength;
  }
  else {
    uVar4 = (int)sVar1 >> 5;
  }
  UNRECOVERED_JUMPTABLE = (this->super_Collator).super_UObject._vptr_UObject[0x1b];
  uVar2 = (*UNRECOVERED_JUMPTABLE)(this,pcVar3,(ulong)uVar4,errorCode,UNRECOVERED_JUMPTABLE);
  return uVar2;
}

Assistant:

uint32_t
RuleBasedCollator::setVariableTop(const UnicodeString &varTop, UErrorCode &errorCode) {
    return setVariableTop(varTop.getBuffer(), varTop.length(), errorCode);
}